

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O0

void ParseOptions(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte local_4c6;
  byte local_4c5;
  byte local_4c4;
  byte local_4c3;
  byte local_4c2;
  byte local_4c1;
  byte local_4c0;
  byte local_4bf;
  byte local_4be;
  byte local_4bd;
  byte local_4bc;
  byte local_4bb;
  byte local_4ba;
  byte local_4b9;
  byte local_4b8;
  byte local_4b7;
  byte local_4b6;
  byte local_4b5;
  byte local_4b4;
  allocator<char> local_4b1;
  string local_4b0;
  byte local_48b;
  byte local_48a;
  allocator<char> local_489;
  string local_488;
  byte local_463;
  byte local_462;
  allocator<char> local_461;
  string local_460;
  byte local_43b;
  byte local_43a;
  allocator<char> local_439;
  string local_438;
  byte local_413;
  byte local_412;
  allocator<char> local_411;
  string local_410;
  byte local_3eb;
  byte local_3ea;
  allocator<char> local_3e9;
  string local_3e8;
  byte local_3c3;
  byte local_3c2;
  allocator<char> local_3c1;
  string local_3c0;
  byte local_39b;
  byte local_39a;
  allocator<char> local_399;
  string local_398;
  byte local_373;
  byte local_372;
  allocator<char> local_371;
  string local_370;
  byte local_34b;
  byte local_34a;
  allocator<char> local_349;
  string local_348;
  byte local_323;
  byte local_322;
  allocator<char> local_321;
  string local_320;
  byte local_2fb;
  byte local_2fa;
  allocator<char> local_2f9;
  string local_2f8;
  byte local_2d3;
  byte local_2d2;
  allocator<char> local_2d1;
  string local_2d0;
  byte local_2ab;
  byte local_2aa;
  allocator<char> local_2a9;
  string local_2a8;
  byte local_283;
  byte local_282;
  allocator<char> local_281;
  string local_280;
  byte local_25b;
  byte local_25a;
  allocator<char> local_259;
  string local_258;
  byte local_233;
  byte local_232;
  allocator<char> local_231;
  string local_230;
  byte local_20b;
  byte local_20a;
  allocator<char> local_209;
  string local_208;
  byte local_1e3;
  byte local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  byte local_1ba;
  anon_class_1_0_00000001 local_1b9;
  undefined1 local_1b8 [6];
  bool any_non_supported_feature;
  allocator<char> local_191;
  string local_190;
  anon_class_1_0_00000001 local_169;
  NullCallback local_168;
  anon_class_1_0_00000001 local_141;
  Callback local_140;
  anon_class_1_0_00000001 local_119;
  Callback local_118;
  anon_class_1_0_00000001 local_f1;
  Callback local_f0;
  anon_class_1_0_00000001 local_c9;
  NullCallback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  char **argv_local;
  int argc_local;
  
  parser.on_error_._M_invoker = (_Invoker_type)argv;
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_a8,"wasm2c",
             "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
            );
  std::function<void()>::function<ParseOptions(int,char**)::__0,void>
            ((function<void()> *)&local_c8,&local_c9);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'v',"verbose","Use multiple times for more info",&local_c8);
  std::function<void_()>::~function(&local_c8);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__1,void>
            ((function<void(char_const*)> *)&local_f0,&local_f1);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'o',"output","FILENAME",
             "Output file for the generated C source file, by default use stdout",&local_f0);
  std::function<void_(const_char_*)>::~function(&local_f0);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__2,void>
            ((function<void(char_const*)> *)&local_118,&local_119);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'\0',"num-outputs","NUM","Number of output files to write",
             &local_118);
  std::function<void_(const_char_*)>::~function(&local_118);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__3,void>
            ((function<void(char_const*)> *)&local_140,&local_141);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'n',"module-name","MODNAME",
             "Unique name for the module being generated. This name is prefixed to\neach of the generaed C symbols. By default, the module name from the\nnames section is used. If that is not present the name of the input\nfile is used as the default.\n"
             ,&local_140);
  std::function<void_(const_char_*)>::~function(&local_140);
  wabt::Features::AddOptions(&s_write_c_options.features,(OptionParser *)local_a8);
  std::function<void()>::function<ParseOptions(int,char**)::__4,void>
            ((function<void()> *)&local_168,&local_169);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"no-debug-names","Ignore debug names in the binary file",
             &local_168);
  std::function<void_()>::~function(&local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"filename",&local_191);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__5,void>
            ((function<void(char_const*)> *)local_1b8,&local_1b9);
  wabt::OptionParser::AddArgument((OptionParser *)local_a8,&local_190,One,(Callback *)local_1b8);
  std::function<void_(const_char_*)>::~function((function<void_(const_char_*)> *)local_1b8);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  wabt::OptionParser::Parse((OptionParser *)local_a8,argc,(char **)parser.on_error_._M_invoker);
  local_1ba = 0;
  bVar2 = wabt::Features::exceptions_enabled(&s_write_c_options.features);
  local_1e2 = 0;
  local_1e3 = 0;
  local_4b4 = 0;
  if (bVar2) {
    bVar2 = wabt::Features::exceptions_enabled(&s_write_c_options.features);
    local_4b4 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_1e2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"exceptions",&local_1e1);
      local_1e3 = 1;
      bVar2 = IsFeatureSupported(&local_1e0);
      local_4b4 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4b4 & 1) != 0;
  if ((local_1e3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  if ((local_1e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1e1);
  }
  bVar2 = wabt::Features::mutable_globals_enabled(&s_write_c_options.features);
  local_20a = 0;
  local_20b = 0;
  local_4b5 = 0;
  if (!bVar2) {
    bVar2 = wabt::Features::mutable_globals_enabled(&s_write_c_options.features);
    local_4b5 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_20a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"mutable-globals",&local_209);
      local_20b = 1;
      bVar2 = IsFeatureSupported(&local_208);
      local_4b5 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4b5 & 1) != 0;
  if ((local_20b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_208);
  }
  if ((local_20a & 1) != 0) {
    std::allocator<char>::~allocator(&local_209);
  }
  bVar2 = wabt::Features::sat_float_to_int_enabled(&s_write_c_options.features);
  local_232 = 0;
  local_233 = 0;
  local_4b6 = 0;
  if (!bVar2) {
    bVar2 = wabt::Features::sat_float_to_int_enabled(&s_write_c_options.features);
    local_4b6 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_232 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"saturating-float-to-int",&local_231);
      local_233 = 1;
      bVar2 = IsFeatureSupported(&local_230);
      local_4b6 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4b6 & 1) != 0;
  if ((local_233 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_230);
  }
  if ((local_232 & 1) != 0) {
    std::allocator<char>::~allocator(&local_231);
  }
  bVar2 = wabt::Features::sign_extension_enabled(&s_write_c_options.features);
  local_25a = 0;
  local_25b = 0;
  local_4b7 = 0;
  if (!bVar2) {
    bVar2 = wabt::Features::sign_extension_enabled(&s_write_c_options.features);
    local_4b7 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_25a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"sign-extension",&local_259);
      local_25b = 1;
      bVar2 = IsFeatureSupported(&local_258);
      local_4b7 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4b7 & 1) != 0;
  if ((local_25b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_258);
  }
  if ((local_25a & 1) != 0) {
    std::allocator<char>::~allocator(&local_259);
  }
  bVar2 = wabt::Features::simd_enabled(&s_write_c_options.features);
  local_282 = 0;
  local_283 = 0;
  local_4b8 = 0;
  if (!bVar2) {
    bVar2 = wabt::Features::simd_enabled(&s_write_c_options.features);
    local_4b8 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_282 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"simd",&local_281);
      local_283 = 1;
      bVar2 = IsFeatureSupported(&local_280);
      local_4b8 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4b8 & 1) != 0;
  if ((local_283 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((local_282 & 1) != 0) {
    std::allocator<char>::~allocator(&local_281);
  }
  bVar2 = wabt::Features::threads_enabled(&s_write_c_options.features);
  local_2aa = 0;
  local_2ab = 0;
  local_4b9 = 0;
  if (bVar2) {
    bVar2 = wabt::Features::threads_enabled(&s_write_c_options.features);
    local_4b9 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_2aa = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"threads",&local_2a9);
      local_2ab = 1;
      bVar2 = IsFeatureSupported(&local_2a8);
      local_4b9 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4b9 & 1) != 0;
  if ((local_2ab & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  if ((local_2aa & 1) != 0) {
    std::allocator<char>::~allocator(&local_2a9);
  }
  bVar2 = wabt::Features::function_references_enabled(&s_write_c_options.features);
  local_2d2 = 0;
  local_2d3 = 0;
  local_4ba = 0;
  if (bVar2) {
    bVar2 = wabt::Features::function_references_enabled(&s_write_c_options.features);
    local_4ba = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_2d2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"function-references",&local_2d1);
      local_2d3 = 1;
      bVar2 = IsFeatureSupported(&local_2d0);
      local_4ba = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4ba & 1) != 0;
  if ((local_2d3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  if ((local_2d2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_2d1);
  }
  bVar2 = wabt::Features::multi_value_enabled(&s_write_c_options.features);
  local_2fa = 0;
  local_2fb = 0;
  local_4bb = 0;
  if (!bVar2) {
    bVar2 = wabt::Features::multi_value_enabled(&s_write_c_options.features);
    local_4bb = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_2fa = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"multi-value",&local_2f9);
      local_2fb = 1;
      bVar2 = IsFeatureSupported(&local_2f8);
      local_4bb = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4bb & 1) != 0;
  if ((local_2fb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2f8);
  }
  if ((local_2fa & 1) != 0) {
    std::allocator<char>::~allocator(&local_2f9);
  }
  bVar2 = wabt::Features::tail_call_enabled(&s_write_c_options.features);
  local_322 = 0;
  local_323 = 0;
  local_4bc = 0;
  if (bVar2) {
    bVar2 = wabt::Features::tail_call_enabled(&s_write_c_options.features);
    local_4bc = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_322 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,"tail-call",&local_321);
      local_323 = 1;
      bVar2 = IsFeatureSupported(&local_320);
      local_4bc = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4bc & 1) != 0;
  if ((local_323 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((local_322 & 1) != 0) {
    std::allocator<char>::~allocator(&local_321);
  }
  bVar2 = wabt::Features::bulk_memory_enabled(&s_write_c_options.features);
  local_34a = 0;
  local_34b = 0;
  local_4bd = 0;
  if (!bVar2) {
    bVar2 = wabt::Features::bulk_memory_enabled(&s_write_c_options.features);
    local_4bd = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_34a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"bulk-memory",&local_349);
      local_34b = 1;
      bVar2 = IsFeatureSupported(&local_348);
      local_4bd = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4bd & 1) != 0;
  if ((local_34b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_348);
  }
  if ((local_34a & 1) != 0) {
    std::allocator<char>::~allocator(&local_349);
  }
  bVar2 = wabt::Features::reference_types_enabled(&s_write_c_options.features);
  local_372 = 0;
  local_373 = 0;
  local_4be = 0;
  if (!bVar2) {
    bVar2 = wabt::Features::reference_types_enabled(&s_write_c_options.features);
    local_4be = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_372 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"reference-types",&local_371);
      local_373 = 1;
      bVar2 = IsFeatureSupported(&local_370);
      local_4be = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4be & 1) != 0;
  if ((local_373 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_370);
  }
  if ((local_372 & 1) != 0) {
    std::allocator<char>::~allocator(&local_371);
  }
  bVar2 = wabt::Features::annotations_enabled(&s_write_c_options.features);
  local_39a = 0;
  local_39b = 0;
  local_4bf = 0;
  if (bVar2) {
    bVar2 = wabt::Features::annotations_enabled(&s_write_c_options.features);
    local_4bf = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_39a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"annotations",&local_399);
      local_39b = 1;
      bVar2 = IsFeatureSupported(&local_398);
      local_4bf = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4bf & 1) != 0;
  if ((local_39b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_398);
  }
  if ((local_39a & 1) != 0) {
    std::allocator<char>::~allocator(&local_399);
  }
  bVar2 = wabt::Features::code_metadata_enabled(&s_write_c_options.features);
  local_3c2 = 0;
  local_3c3 = 0;
  local_4c0 = 0;
  if (bVar2) {
    bVar2 = wabt::Features::code_metadata_enabled(&s_write_c_options.features);
    local_4c0 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_3c2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"code-metadata",&local_3c1);
      local_3c3 = 1;
      bVar2 = IsFeatureSupported(&local_3c0);
      local_4c0 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4c0 & 1) != 0;
  if ((local_3c3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  if ((local_3c2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_3c1);
  }
  bVar2 = wabt::Features::gc_enabled(&s_write_c_options.features);
  local_3ea = 0;
  local_3eb = 0;
  local_4c1 = 0;
  if (bVar2) {
    bVar2 = wabt::Features::gc_enabled(&s_write_c_options.features);
    local_4c1 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_3ea = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"gc",&local_3e9);
      local_3eb = 1;
      bVar2 = IsFeatureSupported(&local_3e8);
      local_4c1 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4c1 & 1) != 0;
  if ((local_3eb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_3e8);
  }
  if ((local_3ea & 1) != 0) {
    std::allocator<char>::~allocator(&local_3e9);
  }
  bVar2 = wabt::Features::memory64_enabled(&s_write_c_options.features);
  local_412 = 0;
  local_413 = 0;
  local_4c2 = 0;
  if (bVar2) {
    bVar2 = wabt::Features::memory64_enabled(&s_write_c_options.features);
    local_4c2 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_412 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"memory64",&local_411)
      ;
      local_413 = 1;
      bVar2 = IsFeatureSupported(&local_410);
      local_4c2 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4c2 & 1) != 0;
  if ((local_413 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_410);
  }
  if ((local_412 & 1) != 0) {
    std::allocator<char>::~allocator(&local_411);
  }
  bVar2 = wabt::Features::multi_memory_enabled(&s_write_c_options.features);
  local_43a = 0;
  local_43b = 0;
  local_4c3 = 0;
  if (bVar2) {
    bVar2 = wabt::Features::multi_memory_enabled(&s_write_c_options.features);
    local_4c3 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_43a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"multi-memory",&local_439);
      local_43b = 1;
      bVar2 = IsFeatureSupported(&local_438);
      local_4c3 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4c3 & 1) != 0;
  if ((local_43b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_438);
  }
  if ((local_43a & 1) != 0) {
    std::allocator<char>::~allocator(&local_439);
  }
  bVar2 = wabt::Features::extended_const_enabled(&s_write_c_options.features);
  local_462 = 0;
  local_463 = 0;
  local_4c4 = 0;
  if (bVar2) {
    bVar2 = wabt::Features::extended_const_enabled(&s_write_c_options.features);
    local_4c4 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_462 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,"extended-const",&local_461);
      local_463 = 1;
      bVar2 = IsFeatureSupported(&local_460);
      local_4c4 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4c4 & 1) != 0;
  if ((local_463 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_460);
  }
  if ((local_462 & 1) != 0) {
    std::allocator<char>::~allocator(&local_461);
  }
  bVar2 = wabt::Features::relaxed_simd_enabled(&s_write_c_options.features);
  local_48a = 0;
  local_48b = 0;
  local_4c5 = 0;
  if (bVar2) {
    bVar2 = wabt::Features::relaxed_simd_enabled(&s_write_c_options.features);
    local_4c5 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_48a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"relaxed-simd",&local_489);
      local_48b = 1;
      bVar2 = IsFeatureSupported(&local_488);
      local_4c5 = bVar2 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4c5 & 1) != 0;
  if ((local_48b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_488);
  }
  if ((local_48a & 1) != 0) {
    std::allocator<char>::~allocator(&local_489);
  }
  bVar3 = wabt::Features::custom_page_sizes_enabled(&s_write_c_options.features);
  bVar1 = false;
  bVar2 = false;
  local_4c6 = 0;
  if (bVar3) {
    bVar3 = wabt::Features::custom_page_sizes_enabled(&s_write_c_options.features);
    local_4c6 = 0;
    if (bVar3) {
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"custom-page-sizes",&local_4b1);
      bVar2 = true;
      bVar3 = IsFeatureSupported(&local_4b0);
      local_4c6 = bVar3 ^ 0xff;
    }
  }
  local_1ba = (local_1ba & 1) != 0 || (local_4c6 & 1) != 0;
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_4b0);
  }
  if (bVar1) {
    std::allocator<char>::~allocator(&local_4b1);
  }
  if ((local_1ba & 1) == 0) {
    wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
    return;
  }
  fprintf(_stderr,"wasm2c currently only supports a limited set of features.\n");
  exit(1);
}

Assistant:

static void ParseOptions(int argc, char** argv) {
  OptionParser parser("wasm2c", s_description);

  parser.AddOption('v', "verbose", "Use multiple times for more info", []() {
    s_verbose++;
    s_log_stream = FileStream::CreateStderr();
  });
  parser.AddOption(
      'o', "output", "FILENAME",
      "Output file for the generated C source file, by default use stdout",
      [](const char* argument) {
        s_outfile = argument;
        ConvertBackslashToSlash(&s_outfile);
      });
  parser.AddOption(
      '\0', "num-outputs", "NUM", "Number of output files to write",
      [](const char* argument) { s_num_outputs = atoi(argument); });
  parser.AddOption(
      'n', "module-name", "MODNAME",
      "Unique name for the module being generated. This name is prefixed to\n"
      "each of the generaed C symbols. By default, the module name from the\n"
      "names section is used. If that is not present the name of the input\n"
      "file is used as the default.\n",
      [](const char* argument) { s_write_c_options.module_name = argument; });
  s_write_c_options.features.AddOptions(&parser);
  parser.AddOption("no-debug-names", "Ignore debug names in the binary file",
                   []() { s_read_debug_names = false; });
  parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                     [](const char* argument) {
                       s_infile = argument;
                       ConvertBackslashToSlash(&s_infile);
                     });
  parser.Parse(argc, argv);

  bool any_non_supported_feature = false;
#define WABT_FEATURE(variable, flag, default_, help)                   \
  any_non_supported_feature |=                                         \
      (s_write_c_options.features.variable##_enabled() != default_) && \
      s_write_c_options.features.variable##_enabled() &&               \
      !IsFeatureSupported(flag);
#include "wabt/feature.def"
#undef WABT_FEATURE

  if (any_non_supported_feature) {
    fprintf(stderr,
            "wasm2c currently only supports a limited set of features.\n");
    exit(1);
  }
}